

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t ZSTD_compressBlock_lazy_extDict
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  int *iEnd;
  undefined8 *puVar1;
  U32 UVar2;
  undefined8 uVar3;
  uint uVar4;
  int iVar5;
  size_t sVar6;
  ulong uVar7;
  BYTE *pBVar8;
  U32 UVar9;
  int *piVar10;
  BYTE *pBVar11;
  uint uVar12;
  int iVar13;
  int *ip;
  uint uVar14;
  ulong uVar15;
  int *piVar16;
  uint uVar17;
  int *ip_00;
  ulong uVar18;
  long lVar19;
  seqDef *psVar20;
  ulong uVar21;
  uint local_104;
  size_t ofbCandidate;
  ulong local_e8;
  ulong local_e0;
  BYTE *local_d8;
  int local_d0;
  uint local_cc;
  int *local_c8;
  ZSTD_matchState_t *local_c0;
  BYTE *local_b8;
  BYTE *local_b0;
  int *local_a8;
  int *local_a0;
  U32 maxDistance;
  int *local_90;
  int *local_88;
  int *local_80;
  int *local_78;
  BYTE *local_70;
  ulong local_68;
  ulong local_60;
  ulong local_58;
  U32 *local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  local_d8 = (ms->window).base;
  local_b0 = (ms->window).dictBase;
  uVar17 = (ms->window).dictLimit;
  local_e8 = (ulong)uVar17;
  local_a0 = (int *)(local_b0 + local_e8);
  local_70 = local_b0 + (ms->window).lowLimit;
  uVar4 = (ms->cParams).windowLog;
  uVar12 = (ms->cParams).minMatch;
  uVar14 = 6;
  if (uVar12 < 6) {
    uVar14 = uVar12;
  }
  local_cc = 4;
  if (4 < uVar14) {
    local_cc = uVar14;
  }
  uVar12 = *rep;
  local_104 = rep[1];
  ms->lazySkipping = 0;
  local_b8 = local_d8 + local_e8;
  uVar4 = 1 << ((byte)uVar4 & 0x1f);
  _maxDistance = (ulong)uVar4;
  iVar5 = (int)local_d8;
  local_60 = (ulong)(1 - (uVar4 + iVar5));
  ip = (int *)((ulong)(local_b8 == (BYTE *)src) + (long)src);
  iEnd = (int *)((long)src + srcSize);
  local_90 = (int *)((long)src + (srcSize - 8));
  local_a8 = (int *)((long)src + (srcSize - 0x20));
  local_58 = (ulong)(1 - iVar5);
  local_d0 = uVar17 - 1;
  local_68 = (ulong)((uVar17 + iVar5) - 2);
  uVar18 = (ulong)uVar12;
  local_c0 = ms;
  local_50 = rep;
LAB_0014a2f9:
  do {
    local_e0 = uVar18;
    uVar17 = (uint)local_e0;
    if (local_90 <= ip) {
      *local_50 = uVar17;
      local_50[1] = local_104;
      return (long)iEnd - (long)src;
    }
    iVar13 = (int)ip;
    iVar5 = (iVar13 - (int)local_d8) + 1;
    UVar2 = (ms->window).lowLimit;
    UVar9 = iVar5 - (uint)_maxDistance;
    if (iVar5 - UVar2 <= (uint)_maxDistance) {
      UVar9 = UVar2;
    }
    if (ms->loadedDictEnd != 0) {
      UVar9 = UVar2;
    }
    uVar12 = iVar5 - uVar17;
    pBVar8 = local_b0;
    if ((uint)local_e8 <= uVar12) {
      pBVar8 = local_d8;
    }
    piVar16 = (int *)((long)ip + 1);
    if (local_d0 - uVar12 < 3) {
LAB_0014a395:
      uVar18 = 0;
    }
    else {
      uVar18 = 0;
      if (uVar17 <= iVar5 - UVar9) {
        if (*piVar16 != *(int *)(pBVar8 + uVar12)) goto LAB_0014a395;
        piVar10 = local_a0;
        if ((uint)local_e8 <= uVar12) {
          piVar10 = iEnd;
        }
        sVar6 = ZSTD_count_2segments
                          ((BYTE *)((long)ip + 5),(BYTE *)((long)(pBVar8 + uVar12) + 4),(BYTE *)iEnd
                           ,(BYTE *)piVar10,local_b8);
        uVar18 = sVar6 + 4;
      }
    }
    ofbCandidate = 999999999;
    if (local_cc == 6) {
      uVar7 = ZSTD_HcFindBestMatch_extDict_6(ms,(BYTE *)ip,(BYTE *)iEnd,&ofbCandidate);
    }
    else if (local_cc == 5) {
      uVar7 = ZSTD_HcFindBestMatch_extDict_5(ms,(BYTE *)ip,(BYTE *)iEnd,&ofbCandidate);
    }
    else {
      uVar7 = ZSTD_HcFindBestMatch_extDict_4(ms,(BYTE *)ip,(BYTE *)iEnd,&ofbCandidate);
    }
    uVar21 = uVar18;
    if (uVar18 < uVar7) {
      uVar21 = uVar7;
    }
    if (uVar21 < 4) {
      uVar18 = (long)ip - (long)src;
      ip = (int *)((long)ip + (uVar18 >> 8) + 1);
      ms->lazySkipping = (uint)(0x8ff < uVar18);
      uVar18 = local_e0;
      goto LAB_0014a2f9;
    }
    uVar15 = 1;
    if (uVar18 < uVar7) {
      piVar16 = ip;
      uVar15 = ofbCandidate;
    }
    local_38 = (ulong)(uint)((int)local_60 + iVar13);
    local_40 = (ulong)(uint)((int)local_58 + iVar13);
    uVar17 = ((int)local_68 + (int)local_e0) - iVar13;
    local_48 = (ulong)(uint)(((int)local_58 - (int)local_e0) + iVar13);
    piVar10 = ip;
    local_78 = (int *)src;
    for (lVar19 = 0; (int *)((long)ip + lVar19) < local_90; lVar19 = lVar19 + 1) {
      ip_00 = (int *)((long)ip + lVar19 + 1);
      local_c8 = piVar16;
      if (uVar15 == 0) {
        uVar15 = 0;
      }
      else {
        UVar2 = (ms->window).lowLimit;
        iVar13 = (int)lVar19;
        iVar5 = (int)local_40 + iVar13;
        UVar9 = (int)local_38 + iVar13;
        if (iVar5 - UVar2 <= maxDistance) {
          UVar9 = UVar2;
        }
        if (ms->loadedDictEnd != 0) {
          UVar9 = UVar2;
        }
        uVar12 = (int)local_48 + iVar13;
        pBVar8 = local_d8;
        if (uVar12 < (uint)local_e8) {
          pBVar8 = local_b0;
        }
        if (((2 < uVar17) && ((uint)local_e0 <= iVar5 - UVar9)) &&
           (*ip_00 == *(int *)(pBVar8 + uVar12))) {
          piVar16 = iEnd;
          if (uVar12 < (uint)local_e8) {
            piVar16 = local_a0;
          }
          local_88 = ip_00;
          local_80 = piVar10;
          sVar6 = ZSTD_count_2segments
                            ((BYTE *)((long)ip + lVar19 + 5),(BYTE *)((long)(pBVar8 + uVar12) + 4),
                             (BYTE *)iEnd,(BYTE *)piVar16,local_b8);
          piVar10 = local_80;
          ip_00 = local_88;
          if (sVar6 < 0xfffffffffffffffc) {
            uVar12 = 0x1f;
            if ((uint)uVar15 != 0) {
              for (; (uint)uVar15 >> uVar12 == 0; uVar12 = uVar12 - 1) {
              }
            }
            if ((int)((uVar12 ^ 0x1f) + (int)uVar21 * 3 + -0x1e) < (int)(sVar6 + 4) * 3) {
              uVar15 = 1;
              local_c8 = local_88;
              uVar21 = sVar6 + 4;
            }
          }
        }
      }
      ofbCandidate = 999999999;
      if (local_cc == 6) {
        uVar18 = ZSTD_HcFindBestMatch_extDict_6(ms,(BYTE *)ip_00,(BYTE *)iEnd,&ofbCandidate);
      }
      else if (local_cc == 5) {
        uVar18 = ZSTD_HcFindBestMatch_extDict_5(local_c0,(BYTE *)ip_00,(BYTE *)iEnd,&ofbCandidate);
      }
      else {
        uVar18 = ZSTD_HcFindBestMatch_extDict_4(local_c0,(BYTE *)ip_00,(BYTE *)iEnd,&ofbCandidate);
      }
      piVar16 = local_c8;
      ms = local_c0;
      if (uVar18 < 4) break;
      uVar12 = 0x1f;
      if ((uint)uVar15 != 0) {
        for (; (uint)uVar15 >> uVar12 == 0; uVar12 = uVar12 - 1) {
        }
      }
      iVar5 = 0x1f;
      if ((uint)ofbCandidate != 0) {
        for (; (uint)ofbCandidate >> iVar5 == 0; iVar5 = iVar5 + -1) {
        }
      }
      if ((int)uVar18 * 4 - iVar5 <= (int)((uVar12 ^ 0x1f) + (int)uVar21 * 4 + -0x1b)) break;
      piVar16 = (int *)((long)piVar10 + 1);
      uVar17 = uVar17 - 1;
      uVar15 = ofbCandidate;
      piVar10 = piVar16;
      uVar21 = uVar18;
    }
    if (3 < uVar15) {
      uVar18 = (long)piVar16 + (-(long)local_d8 - uVar15) + 3;
      pBVar11 = local_b8;
      pBVar8 = local_d8;
      if ((uint)uVar18 < (uint)local_e8) {
        pBVar11 = local_70;
        pBVar8 = local_b0;
      }
      pBVar8 = pBVar8 + (uVar18 & 0xffffffff);
      for (; ((local_78 < piVar16 && (pBVar11 < pBVar8)) &&
             (*(BYTE *)((long)piVar16 + -1) == pBVar8[-1])); piVar16 = (int *)((long)piVar16 + -1))
      {
        pBVar8 = pBVar8 + -1;
        uVar21 = uVar21 + 1;
      }
      local_104 = (uint)local_e0;
      local_e0 = (ulong)((U32)uVar15 - 3);
    }
    if (seqStore->maxNbSeq <=
        (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)) {
LAB_0014aa5f:
      __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x468b,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    if (0x20000 < seqStore->maxNbLit) {
LAB_0014aa7e:
      __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x468d,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    uVar18 = (long)piVar16 - (long)local_78;
    pBVar8 = seqStore->lit;
    if (seqStore->litStart + seqStore->maxNbLit < pBVar8 + uVar18) {
LAB_0014aabc:
      __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x468e,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    if (iEnd < piVar16) {
LAB_0014aadb:
      __assert_fail("literals + litLength <= litLimit",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x468f,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    if (local_a8 < piVar16) {
      ZSTD_safecopyLiterals(pBVar8,(BYTE *)local_78,(BYTE *)piVar16,(BYTE *)local_a8);
LAB_0014a77f:
      seqStore->lit = seqStore->lit + uVar18;
      if (0xffff < uVar18) {
        if (seqStore->longLengthType != ZSTD_llt_none) {
          __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x46a0,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        seqStore->longLengthType = ZSTD_llt_literalLength;
        seqStore->longLengthPos =
             (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
      }
    }
    else {
      uVar3 = *(undefined8 *)(local_78 + 2);
      *(undefined8 *)pBVar8 = *(undefined8 *)local_78;
      *(undefined8 *)(pBVar8 + 8) = uVar3;
      pBVar8 = seqStore->lit;
      if (0x10 < uVar18) {
        if ((BYTE *)0xffffffffffffffe0 < pBVar8 + 0x10 + (-0x10 - (long)(local_78 + 4))) {
          __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x36a6,
                        "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)")
          ;
        }
        uVar3 = *(undefined8 *)(local_78 + 6);
        *(undefined8 *)(pBVar8 + 0x10) = *(undefined8 *)(local_78 + 4);
        *(undefined8 *)(pBVar8 + 0x18) = uVar3;
        if (0x20 < (long)uVar18) {
          lVar19 = 0;
          do {
            puVar1 = (undefined8 *)((long)local_78 + lVar19 + 0x20);
            uVar3 = puVar1[1];
            pBVar11 = pBVar8 + lVar19 + 0x20;
            *(undefined8 *)pBVar11 = *puVar1;
            *(undefined8 *)(pBVar11 + 8) = uVar3;
            puVar1 = (undefined8 *)((long)local_78 + lVar19 + 0x30);
            uVar3 = puVar1[1];
            *(undefined8 *)(pBVar11 + 0x10) = *puVar1;
            *(undefined8 *)(pBVar11 + 0x18) = uVar3;
            lVar19 = lVar19 + 0x20;
          } while (pBVar11 + 0x20 < pBVar8 + uVar18);
        }
        goto LAB_0014a77f;
      }
      seqStore->lit = pBVar8 + uVar18;
    }
    psVar20 = seqStore->sequences;
    psVar20->litLength = (U16)uVar18;
    psVar20->offBase = (U32)uVar15;
    if (uVar21 < 3) {
LAB_0014aa9d:
      __assert_fail("matchLength >= MINMATCH",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x46aa,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    if (0xffff < uVar21 - 3) {
      if (seqStore->longLengthType != ZSTD_llt_none) {
LAB_0014aafa:
        __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x46ad,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      seqStore->longLengthType = ZSTD_llt_matchLength;
      seqStore->longLengthPos = (U32)((ulong)((long)psVar20 - (long)seqStore->sequencesStart) >> 3);
    }
    psVar20->mlBase = (U16)(uVar21 - 3);
    psVar20 = psVar20 + 1;
    seqStore->sequences = psVar20;
    if (ms->lazySkipping != 0) {
      ms->lazySkipping = 0;
    }
    uVar18 = local_e0;
    for (ip = (int *)((long)piVar16 + uVar21); uVar7 = (ulong)local_104, src = ip, ip <= local_90;
        ip = (int *)((long)ip + sVar6 + 4)) {
      iVar5 = (int)ip - (int)local_d8;
      UVar2 = (ms->window).lowLimit;
      UVar9 = iVar5 - (uint)_maxDistance;
      if (iVar5 - UVar2 <= (uint)_maxDistance) {
        UVar9 = UVar2;
      }
      if (ms->loadedDictEnd != 0) {
        UVar9 = UVar2;
      }
      uVar17 = iVar5 - local_104;
      pBVar8 = local_d8;
      if (uVar17 < (uint)local_e8) {
        pBVar8 = local_b0;
      }
      if (((local_d0 - uVar17 < 3) || (iVar5 - UVar9 < local_104)) ||
         (*ip != *(int *)(pBVar8 + uVar17))) break;
      piVar16 = iEnd;
      if (uVar17 < (uint)local_e8) {
        piVar16 = local_a0;
      }
      sVar6 = ZSTD_count_2segments
                        ((BYTE *)(ip + 1),(BYTE *)((long)(pBVar8 + uVar17) + 4),(BYTE *)iEnd,
                         (BYTE *)piVar16,local_b8);
      if (seqStore->maxNbSeq <= (ulong)((long)psVar20 - (long)seqStore->sequencesStart >> 3))
      goto LAB_0014aa5f;
      if (0x20000 < seqStore->maxNbLit) goto LAB_0014aa7e;
      pBVar8 = seqStore->lit;
      if (seqStore->litStart + seqStore->maxNbLit < pBVar8) goto LAB_0014aabc;
      if (iEnd < ip) goto LAB_0014aadb;
      if (local_a8 < ip) {
        ZSTD_safecopyLiterals(pBVar8,(BYTE *)ip,(BYTE *)ip,(BYTE *)local_a8);
      }
      else {
        uVar3 = *(undefined8 *)(ip + 2);
        *(undefined8 *)pBVar8 = *(undefined8 *)ip;
        *(undefined8 *)(pBVar8 + 8) = uVar3;
      }
      psVar20 = seqStore->sequences;
      psVar20->litLength = 0;
      psVar20->offBase = 1;
      if (sVar6 + 4 < 3) goto LAB_0014aa9d;
      if (0xffff < sVar6 + 1) {
        if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_0014aafa;
        seqStore->longLengthType = ZSTD_llt_matchLength;
        seqStore->longLengthPos =
             (U32)((ulong)((long)psVar20 - (long)seqStore->sequencesStart) >> 3);
      }
      psVar20->mlBase = (U16)(sVar6 + 1);
      psVar20 = psVar20 + 1;
      seqStore->sequences = psVar20;
      local_104 = (uint)uVar18;
      uVar18 = uVar7;
    }
  } while( true );
}

Assistant:

size_t ZSTD_compressBlock_lazy_extDict(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)

{
    return ZSTD_compressBlock_lazy_extDict_generic(ms, seqStore, rep, src, srcSize, search_hashChain, 1);
}